

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_generic_configsocket.c
# Opt level: O2

int os_fd_generic_configsocket
              (os_fd *sock,netaddr_socket *bind_to,size_t recvbuf,_Bool rawip,os_interface *os_if,
              oonf_log_source log_src)

{
  int iVar1;
  char *pcVar2;
  uint *puVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  char *format;
  netaddr_socket *pnVar7;
  netaddr_socket *pnVar8;
  ulong uVar9;
  size_t recvbuf_local;
  int value;
  netaddr_str buf;
  netaddr_socket bindto;
  
  pnVar7 = bind_to;
  pnVar8 = &bindto;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    *(undefined8 *)pnVar8 = *(undefined8 *)pnVar7;
    pnVar7 = (netaddr_socket *)(pnVar7->v4).sin_zero;
    pnVar8 = (netaddr_socket *)(pnVar8->v4).sin_zero;
  }
  recvbuf_local = recvbuf;
  iVar1 = os_fd_generic_set_nonblocking(sock);
  if (iVar1 == 0) {
    if ((!rawip) && ((bind_to->v4).sin_family == 10)) {
      value = 1;
      iVar1 = setsockopt(sock->fd,0x29,0x1a,&value,4);
      if ((iVar1 < 0) && ((log_global_mask[log_src] & 4) != 0)) {
        puVar3 = (uint *)__errno_location();
        pcVar2 = strerror(*puVar3);
        oonf_log(LOG_SEVERITY_WARN,log_src,"src/base/os_generic/os_fd_generic_configsocket.c",0x5a,
                 (void *)0x0,0,"Could not force socket to IPv6 only, continue: %s (%d)\n",pcVar2,
                 (ulong)*puVar3);
      }
    }
    if ((os_if != (os_interface *)0x0) && ((os_if->flags).any == false)) {
      iVar1 = sock->fd;
      pcVar2 = os_if->name;
      sVar5 = strlen(pcVar2);
      iVar1 = setsockopt(iVar1,1,0x19,pcVar2,(int)sVar5 + 1);
      if (iVar1 < 0) {
        if ((log_global_mask[log_src] & 4) == 0) {
          return -1;
        }
        puVar3 = (uint *)__errno_location();
        pcVar4 = strerror(*puVar3);
        uVar9 = (ulong)*puVar3;
        format = "Cannot bind socket to interface %s: %s (%d)\n";
        iVar1 = 99;
        goto LAB_0011fff9;
      }
    }
    value = 1;
    iVar1 = setsockopt(sock->fd,1,2,&value,4);
    if (iVar1 < 0) {
      if ((log_global_mask[log_src] & 4) == 0) {
        return -1;
      }
      pcVar2 = netaddr_socket_to_string(&buf,&bindto);
      puVar3 = (uint *)__errno_location();
      pcVar4 = strerror(*puVar3);
      uVar9 = (ulong)*puVar3;
      format = "Cannot reuse address for %s: %s (%d)\n";
      iVar1 = 0x6d;
    }
    else {
      if (recvbuf != 0) {
        while ((0x2000 < recvbuf &&
               (iVar1 = setsockopt(sock->fd,1,8,&recvbuf_local,8), recvbuf = recvbuf_local,
               iVar1 != 0))) {
          recvbuf = recvbuf_local - 0x400;
          recvbuf_local = recvbuf;
        }
        if (recvbuf < 0x2000) {
          if ((log_global_mask[log_src] & 4) == 0) {
            return -1;
          }
          pcVar2 = netaddr_socket_to_string(&buf,&bindto);
          puVar3 = (uint *)__errno_location();
          pcVar4 = strerror(*puVar3);
          uVar9 = (ulong)*puVar3;
          format = "Cannot setup receive buffer size for %s: %s (%d)\n";
          iVar1 = 0x86;
          goto LAB_0011fff9;
        }
      }
      if ((os_if != (os_interface *)0x0) && (bindto.v4.sin_family == 10)) {
        bindto.v6.sin6_scope_id = os_if->index;
      }
      iVar1 = bind(sock->fd,(sockaddr *)&bindto.v4,0x80);
      if (-1 < iVar1) {
        return 0;
      }
      if ((log_global_mask[log_src] & 4) == 0) {
        return -1;
      }
      pcVar2 = netaddr_socket_to_string(&buf,&bindto);
      puVar3 = (uint *)__errno_location();
      pcVar4 = strerror(*puVar3);
      uVar9 = (ulong)*puVar3;
      format = "Cannot bind socket to address %s: %s (%d)\n";
      iVar1 = 0x95;
    }
  }
  else {
    if ((log_global_mask[log_src] & 4) == 0) {
      return -1;
    }
    pcVar2 = netaddr_socket_to_string(&buf,&bindto);
    puVar3 = (uint *)__errno_location();
    pcVar4 = strerror(*puVar3);
    uVar9 = (ulong)*puVar3;
    format = "Cannot make socket non-blocking %s: %s (%d)\n";
    iVar1 = 0x52;
  }
LAB_0011fff9:
  oonf_log(LOG_SEVERITY_WARN,log_src,"src/base/os_generic/os_fd_generic_configsocket.c",iVar1,
           (void *)0x0,0,format,pcVar2,pcVar4,uVar9);
  return -1;
}

Assistant:

int
os_fd_generic_configsocket(struct os_fd *sock, const union netaddr_socket *bind_to, size_t recvbuf, bool rawip,
  const struct os_interface *os_if, enum oonf_log_source log_src) {
  union netaddr_socket bindto;
  struct netaddr_str buf;
  socklen_t addrlen;
  int value;

  /* temporary copy bindto address */
  memcpy(&bindto, bind_to, sizeof(bindto));

  if (os_fd_set_nonblocking(sock)) {
    OONF_WARN(log_src, "Cannot make socket non-blocking %s: %s (%d)\n", netaddr_socket_to_string(&buf, &bindto),
      strerror(errno), errno);
    return -1;
  }

#if defined(IPV6_V6ONLY)
  if (!rawip && bind_to->std.sa_family == AF_INET6) {
    value = 1;
    if (setsockopt(sock->fd, IPPROTO_IPV6, IPV6_V6ONLY, (void *)&value, sizeof(value)) < 0) {
      OONF_WARN(log_src, "Could not force socket to IPv6 only, continue: %s (%d)\n", strerror(errno), errno);
    }
  }
#endif

#if defined(SO_BINDTODEVICE)
  /* this is binding the socket, not a multicast address */
  if (os_if != NULL && !os_if->flags.any &&
      setsockopt(sock->fd, SOL_SOCKET, SO_BINDTODEVICE, os_if->name, strlen(os_if->name) + 1) < 0) {
    OONF_WARN(log_src, "Cannot bind socket to interface %s: %s (%d)\n", os_if->name, strerror(errno), errno);
    return -1;
  }
#endif

#if defined(SO_REUSEADDR)
  /* allow to reuse address */
  value = 1;
  if (setsockopt(sock->fd, SOL_SOCKET, SO_REUSEADDR, &value, sizeof(value)) < 0) {
    OONF_WARN(log_src, "Cannot reuse address for %s: %s (%d)\n", netaddr_socket_to_string(&buf, &bindto),
      strerror(errno), errno);
    return -1;
  }
#endif

#if defined(IP_RECVIF)
  if (os_if != NULL && setsockopt(sock, IPPROTO_IP, IP_RECVIF, &yes, sizeof(yes)) < 0) {
    OONF_WARN(log_src, "Cannot apply IP_RECVIF for %s: %s (%d)\n", netaddr_socket_to_string(&buf, &bindto),
      strerror(errno), errno);
    return -1;
  }
#endif

#if defined(SO_RCVBUF)
  if (recvbuf > 0) {
    while (recvbuf > 8192) {
      if (setsockopt(sock->fd, SOL_SOCKET, SO_RCVBUF, (void *)&recvbuf, sizeof(recvbuf)) == 0) {
        break;
      }

      recvbuf -= 1024;
    }

    if (recvbuf < 8192) {
      OONF_WARN(log_src, "Cannot setup receive buffer size for %s: %s (%d)\n", netaddr_socket_to_string(&buf, &bindto),
        strerror(errno), errno);
      return -1;
    }
  }
#endif

  /* add ipv6 interface scope if necessary */
  if (os_if != NULL && netaddr_socket_get_addressfamily(&bindto) == AF_INET6) {
    bindto.v6.sin6_scope_id = os_if->index;
  }

  /* bind the socket to the port number */
  addrlen = sizeof(bindto);
  if (bind(sock->fd, &bindto.std, addrlen) < 0) {
    OONF_WARN(log_src, "Cannot bind socket to address %s: %s (%d)\n", netaddr_socket_to_string(&buf, &bindto),
      strerror(errno), errno);

    return -1;
  }

  return 0;
}